

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O1

void GetCombinedEntropyUnrefined_C
               (uint32_t *X,uint32_t *Y,int length,VP8LBitEntropy *bit_entropy,VP8LStreaks *stats)

{
  int *piVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  bool bVar4;
  uint32_t uVar5;
  uint64_t uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint32_t uVar10;
  bool bVar11;
  
  uVar7 = *Y + *X;
  stats->counts[0] = 0;
  stats->counts[1] = 0;
  stats->streaks[0] = (int  [2])0x0;
  stats->streaks[1] = (int  [2])0x0;
  bit_entropy->entropy = 0;
  bit_entropy->sum = 0;
  bit_entropy->nonzeros = 0;
  bit_entropy->max_val = 0;
  bit_entropy->nonzero_code = 0xffff;
  if (length < 2) {
    uVar9 = 1;
    uVar10 = 0;
  }
  else {
    uVar10 = 0;
    uVar9 = 1;
    do {
      uVar2 = Y[uVar9];
      uVar3 = X[uVar9];
      if (uVar2 + uVar3 != uVar7) {
        uVar5 = (uint32_t)uVar9;
        if (uVar7 != 0) {
          bit_entropy->sum = bit_entropy->sum + (uVar5 - uVar10) * uVar7;
          bit_entropy->nonzeros = (bit_entropy->nonzeros - uVar10) + uVar5;
          bit_entropy->nonzero_code = uVar10;
          if (uVar7 < 0x100) {
            uVar6 = kSLog2Table[uVar7];
          }
          else {
            uVar6 = (*VP8LFastSLog2Slow)(uVar7);
          }
          bit_entropy->entropy = bit_entropy->entropy + (uVar9 - (long)(int)uVar10) * uVar6;
          if (bit_entropy->max_val < uVar7) {
            bit_entropy->max_val = uVar7;
          }
        }
        bVar4 = 3 < (int)(uVar5 - uVar10);
        bVar11 = uVar7 != 0;
        stats->counts[bVar11] = stats->counts[bVar11] + (uint)bVar4;
        stats->streaks[bVar11][bVar4] = (stats->streaks[bVar11][bVar4] - uVar10) + uVar5;
        uVar7 = uVar2 + uVar3;
        uVar10 = uVar5;
      }
      uVar9 = uVar9 + 1;
    } while ((uint)length != uVar9);
  }
  iVar8 = (int)uVar9 - uVar10;
  if (uVar7 != 0) {
    bit_entropy->sum = bit_entropy->sum + iVar8 * uVar7;
    bit_entropy->nonzeros = bit_entropy->nonzeros + iVar8;
    bit_entropy->nonzero_code = uVar10;
    if (uVar7 < 0x100) {
      uVar6 = kSLog2Table[uVar7];
    }
    else {
      uVar6 = (*VP8LFastSLog2Slow)(uVar7);
    }
    bit_entropy->entropy = bit_entropy->entropy + (long)iVar8 * uVar6;
    if (bit_entropy->max_val < uVar7) {
      bit_entropy->max_val = uVar7;
    }
  }
  stats->counts[uVar7 != 0] = stats->counts[uVar7 != 0] + (uint)(3 < iVar8);
  piVar1 = stats->streaks[uVar7 != 0] + (3 < iVar8);
  *piVar1 = *piVar1 + iVar8;
  uVar7 = bit_entropy->sum;
  if ((ulong)uVar7 < 0x100) {
    uVar6 = kSLog2Table[uVar7];
  }
  else {
    uVar6 = (*VP8LFastSLog2Slow)(uVar7);
  }
  bit_entropy->entropy = uVar6 - bit_entropy->entropy;
  return;
}

Assistant:

static void GetCombinedEntropyUnrefined_C(
    const uint32_t X[], const uint32_t Y[], int length,
    VP8LBitEntropy* WEBP_RESTRICT const bit_entropy,
    VP8LStreaks* WEBP_RESTRICT const stats) {
  int i = 1;
  int i_prev = 0;
  uint32_t xy_prev = X[0] + Y[0];

  memset(stats, 0, sizeof(*stats));
  VP8LBitEntropyInit(bit_entropy);

  for (i = 1; i < length; ++i) {
    const uint32_t xy = X[i] + Y[i];
    if (xy != xy_prev) {
      GetEntropyUnrefinedHelper(xy, i, &xy_prev, &i_prev, bit_entropy, stats);
    }
  }
  GetEntropyUnrefinedHelper(0, i, &xy_prev, &i_prev, bit_entropy, stats);

  bit_entropy->entropy = VP8LFastSLog2(bit_entropy->sum) - bit_entropy->entropy;
}